

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void set_ext_params_cpy_exx(xc_func_type *p,double *ext_params)

{
  int iVar1;
  void *pvVar2;
  double *pdVar3;
  ulong uVar4;
  
  iVar1 = (p->info->ext_params).n;
  if ((iVar1 - 1U != 0) && (1 < iVar1)) {
    pvVar2 = p->params;
    pdVar3 = p->ext_params;
    uVar4 = 0;
    do {
      *(double *)((long)pvVar2 + uVar4 * 8) = pdVar3[uVar4];
      uVar4 = uVar4 + 1;
    } while (iVar1 - 1U != uVar4);
  }
  p->cam_alpha = p->ext_params[(long)iVar1 + -1];
  return;
}

Assistant:

void
set_ext_params_cpy_exx(xc_func_type *p, const double *ext_params)
{
  int nparams;
  assert(p != NULL);
  nparams = p->info->ext_params.n - 1;
  copy_params(p, ext_params, nparams);
  set_ext_params_exx(p, ext_params);
}